

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

int __thiscall OpenMD::HBondJumpR::registerHydrogen(HBondJumpR *this,int frame,int hIndex)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  int in_EDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  bool in_stack_0000001f;
  vector<bool,_std::allocator<bool>_> *in_stack_00000020;
  int prevIndex;
  int index;
  value_type_conflict2 *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  int local_14;
  
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)(in_RDI + 0x98),(long)in_ESI);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)in_EDX);
  if (*pvVar3 == -1) {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x99),(long)in_ESI);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
    local_14 = (int)sVar4;
    iVar5 = local_14;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x98),(long)in_ESI);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)in_EDX);
    *pvVar3 = iVar5;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x99),(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_RDI,(value_type_conflict2 *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x9a),(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  *)(in_RDI + 0x9c),(long)in_ESI);
    std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_00000020,in_stack_0000001f);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&in_RDI[0xfd].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (in_ESI == 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x9b),0);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x9d),0);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RDI,(value_type_conflict2 *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
    }
    else {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x98),(long)(in_ESI + -1));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)in_EDX);
      iVar1 = *pvVar3;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x9b),(long)in_ESI);
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x9b),(long)(in_ESI + -1));
      std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)iVar1);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RDI,(value_type_conflict2 *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x9d),(long)in_ESI);
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x9d),(long)(in_ESI + -1));
      std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)iVar1);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RDI,(value_type_conflict2 *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
    }
  }
  else {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x98),(long)in_ESI);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)in_EDX);
    local_14 = *pvVar3;
  }
  return local_14;
}

Assistant:

int HBondJumpR::registerHydrogen(int frame, int hIndex) {
    int index;

    // If this hydrogen wasn't already registered, register it:
    if (GIDtoH_[frame][hIndex] == -1) {
      index = hydrogen_[frame].size();

      GIDtoH_[frame][hIndex] = index;
      hydrogen_[frame].push_back(hIndex);
      acceptor_[frame].push_back(-1);
      selected_[frame].push_back(false);
      rbin_[frame].push_back(-1);

      if (frame == 0) {
        lastAcceptor_[frame].push_back(-1);
        acceptorStartFrame_[frame].push_back(frame);
      } else {
        // Copy the last acceptor.
        int prevIndex = GIDtoH_[frame - 1][hIndex];
        lastAcceptor_[frame].push_back(lastAcceptor_[frame - 1][prevIndex]);
        acceptorStartFrame_[frame].push_back(
            acceptorStartFrame_[frame - 1][prevIndex]);
      }
    } else {
      // This hydrogen was already registered.  Just return the index:
      index = GIDtoH_[frame][hIndex];
    }
    return index;
  }